

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O3

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateAsPackageInitCall(TemporaryObject *this)

{
  bool bVar1;
  pointer pFVar2;
  Package *pPVar3;
  pointer pAVar4;
  Method *pMVar5;
  size_t sVar6;
  long lVar7;
  MethodTable *this_00;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_48;
  
  pFVar2 = (this->thread->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->thread->frames).
                super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pFVar2;
  if (lVar7 != 0) {
    sVar6 = (lVar7 >> 4) * -0xf0f0f0f0f0f0f0f - 1;
    do {
      if ((pFVar2[sVar6].scope)->type == Package) {
        this_00 = (MethodTable *)
                  ((long)((pFVar2[sVar6].package)->clPackage)._M_t.
                         super___uniq_ptr_impl<chatra::Class,_std::default_delete<chatra::Class>_>.
                         _M_t + 0x268);
        local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pMVar5 = MethodTable::find(this_00,(Class *)0x0,this->name,Invalid,&this->args,&local_48);
        if (local_48.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (pMVar5 == (Method *)0x0) {
          return Failed;
        }
        if (pMVar5->position != 0xffffffffffffffff) {
          return Failed;
        }
        if ((pMVar5->super_MethodBase).node == (Node *)0x0) {
          return Failed;
        }
        pPVar3 = pFVar2[sVar6].package;
        bVar1 = this->hasArgs;
        this->type = FrameMethod;
        (this->targetRef).node = (ReferenceNode *)0x0;
        this->frameIndex = 0xffffffffffffffff;
        this->package = pPVar3;
        this->methodTable = this_00;
        this->method0 = pMVar5;
        this->method1 = (Method *)0x0;
        this->methodHasArgs = bVar1;
        this->hasName = false;
        this->hasArgs = false;
        this->hasSetArg = false;
        this->hasVarArgOp = false;
        pAVar4 = (this->args).
                 super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->args).
            super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
            super__Vector_impl_data._M_finish != pAVar4) {
          (this->args).
          super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
          super__Vector_impl_data._M_finish = pAVar4;
        }
        resolveNativeMethod(this,this->name,Invalid);
        return Succeeded;
      }
      sVar6 = pFVar2[sVar6].parentIndex;
    } while (sVar6 != 0xffffffffffffffff);
  }
  return Failed;
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateAsPackageInitCall() {
	chatra_assert(requiresEvaluate());
	chatra_assert(!hasRef());
	chatra_assert(type == Type::Empty && hasName && name == StringId::Init && !hasArgs);

	size_t frameIndex = thread.frames.size() - 1;
	while (frameIndex != SIZE_MAX) {
		auto& f = thread.frames[frameIndex];
		if (f.scope->getScopeType() != ScopeType::Package) {
			frameIndex = f.parentIndex;
			continue;
		}

		auto& table = f.package.clPackage->refConstructors();
		auto* refMethod = table.find(nullptr, name, StringId::Invalid, args, {});
		if (refMethod == nullptr || refMethod->position != SIZE_MAX || refMethod->node == nullptr)
			return EvaluationResult::Failed;

		setFrameMethod(SIZE_MAX, &f.package, &table, refMethod, nullptr, hasArgs);
		resolveNativeMethod(name, StringId::Invalid);
		return EvaluationResult::Succeeded;
	}

	return EvaluationResult::Failed;
}